

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::SyncToChar2SetAndContinueInst::Exec
          (SyncToChar2SetAndContinueInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Char CVar1;
  Char CVar2;
  uint uVar3;
  Type pRVar4;
  CharCount CVar5;
  ulong uVar6;
  
  CVar1 = (this->super_Char2Mixin).cs[0];
  CVar2 = (this->super_Char2Mixin).cs[1];
  pRVar4 = matcher->stats;
  if (pRVar4 != (Type)0x0) {
    pRVar4->numCompares = pRVar4->numCompares + 1;
  }
  uVar3 = *inputOffset;
  uVar6 = (ulong)uVar3;
  CVar5 = inputLength;
  if (inputLength < uVar3) {
    CVar5 = uVar3;
  }
  do {
    if (inputLength <= uVar6) {
LAB_00d4ce2d:
      *matchStart = CVar5;
      *instPointer = *instPointer + 5;
      return false;
    }
    if ((input[uVar6] == CVar1) || (input[uVar6] == CVar2)) {
      CVar5 = (CharCount)uVar6;
      goto LAB_00d4ce2d;
    }
    if (pRVar4 != (Type)0x0) {
      pRVar4->numCompares = pRVar4->numCompares + 1;
    }
    uVar6 = uVar6 + 1;
    *inputOffset = (CharCount)uVar6;
  } while( true );
}

Assistant:

inline bool SyncToChar2SetAndContinueInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const Char matchC0 = cs[0];
        const Char matchC1 = cs[1];
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputLength && input[inputOffset] != matchC0 && input[inputOffset] != matchC1)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        matchStart = inputOffset;
        instPointer += sizeof(*this);
        return false;
    }